

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl.cpp
# Opt level: O0

void __thiscall
pg::DTLSolver::attractVertices
          (DTLSolver *this,int pl,int v,bitset *R,bitset *Z,bitset *G,int max_prio)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  _label_vertex _Var5;
  int local_108;
  byte local_103;
  _label_vertex local_e8;
  Game *local_d8;
  int local_d0;
  _label_vertex local_c8;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [28];
  int to;
  int *curedge_1;
  undefined1 local_70 [7];
  bool escapes;
  undefined1 local_60 [28];
  int from;
  int *curedge;
  bitset *G_local;
  bitset *Z_local;
  bitset *R_local;
  int v_local;
  int pl_local;
  DTLSolver *this_local;
  uintqueue *local_10;
  
  curedge = (int *)G;
  G_local = Z;
  Z_local = R;
  R_local._0_4_ = v;
  R_local._4_4_ = pl;
  _v_local = this;
  register0x00000000 = (uint *)Solver::ins(&this->super_Solver,v);
  do {
    if (*stack0xffffffffffffffb8 == 0xffffffff) {
      return;
    }
    local_60._20_4_ = *stack0xffffffffffffffb8;
    bitset::operator[]((bitset *)local_60,(size_t)G_local);
    bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_60);
    if (bVar1) {
      iVar3 = Solver::owner(&this->super_Solver,local_60._20_4_);
      if ((iVar3 == R_local._4_4_) && (this->str[(int)local_60._20_4_] == -1)) {
        this->str[(int)local_60._20_4_] = (int)R_local;
      }
    }
    else {
      bitset::operator[]((bitset *)local_70,(size_t)Z_local);
      bVar2 = bitset::reference::operator_cast_to_bool((reference *)local_70);
      bVar1 = false;
      if ((bVar2) && (bVar1 = true, -1 < max_prio)) {
        iVar3 = Solver::priority(&this->super_Solver,local_60._20_4_);
        bVar1 = iVar3 <= max_prio;
      }
      if (bVar1) {
        iVar3 = Solver::owner(&this->super_Solver,local_60._20_4_);
        if (iVar3 != R_local._4_4_) {
          curedge_1._7_1_ = 0;
          for (register0x00000000 = Solver::outs(&this->super_Solver,local_60._20_4_);
              *stack0xffffffffffffff80 != -1; register0x00000000 = stack0xffffffffffffff80 + 1) {
            local_98._20_4_ = *stack0xffffffffffffff80;
            bitset::operator[]((bitset *)local_98,(size_t)curedge);
            bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_98);
            local_103 = 0;
            if (bVar1) {
              bitset::operator[]((bitset *)local_a8,(size_t)G_local);
              bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_a8);
              local_103 = bVar1 ^ 0xff;
            }
            if ((local_103 & 1) != 0) {
              curedge_1._7_1_ = 1;
              break;
            }
          }
          if ((curedge_1._7_1_ & 1) != 0) goto LAB_0022112e;
        }
        bitset::operator[]((bitset *)local_b8,(size_t)G_local);
        bitset::reference::operator=((reference *)local_b8,true);
        iVar3 = Solver::owner(&this->super_Solver,local_60._20_4_);
        if (iVar3 == R_local._4_4_) {
          local_108 = (int)R_local;
        }
        else {
          local_108 = -1;
        }
        this->str[(int)local_60._20_4_] = local_108;
        local_10 = &this->Q;
        this_local._4_4_ = local_60._20_4_;
        iVar3 = (this->Q).pointer;
        (this->Q).pointer = iVar3 + 1;
        local_10->queue[iVar3] = local_60._20_4_;
        if (2 < (this->super_Solver).trace) {
          poVar4 = std::operator<<((this->super_Solver).logger,"\x1b[1;37mattracted \x1b[36m");
          _Var5 = Solver::label_vertex(&this->super_Solver,local_60._20_4_);
          local_d8 = _Var5.g;
          local_d0 = _Var5.v;
          local_c8.g = local_d8;
          local_c8.v = local_d0;
          poVar4 = operator<<(poVar4,&local_c8);
          poVar4 = std::operator<<(poVar4,"\x1b[m by \x1b[1;36m");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,R_local._4_4_);
          std::operator<<(poVar4,"\x1b[m");
          iVar3 = Solver::owner(&this->super_Solver,local_60._20_4_);
          if (iVar3 == R_local._4_4_) {
            poVar4 = std::operator<<((this->super_Solver).logger," (via ");
            _Var5 = Solver::label_vertex(&this->super_Solver,(int)R_local);
            local_e8.g = _Var5.g;
            local_e8.v = _Var5.v;
            poVar4 = operator<<(poVar4,&local_e8);
            poVar4 = std::operator<<(poVar4,")");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          }
          else {
            poVar4 = std::operator<<((this->super_Solver).logger," (forced)");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          }
        }
      }
    }
LAB_0022112e:
    register0x00000000 = stack0xffffffffffffffb8 + 1;
  } while( true );
}

Assistant:

void
DTLSolver::attractVertices(const int pl, const int v, bitset &R, bitset &Z, bitset &G, const int max_prio)
{
    // attract vertices with an edge to <v>
    for (auto curedge = ins(v); *curedge != -1; curedge++) {
        int from = *curedge;
        if (Z[from]) {
            // already in Z, maybe set strategy (for vertices in the original target set)
            if (owner(from) == pl and str[from] == -1) str[from] = v;
        } else if (R[from] and (max_prio < 0 or priority(from) <= max_prio)) {
            if (owner(from) != pl) {
                // check if opponent can escape
                bool escapes = false;
                for (auto curedge = outs(from); *curedge != -1; curedge++) {
                    int to = *curedge;
                    if (G[to] and !Z[to]) {
                        escapes = true;
                        break;
                    }
                }
                if (escapes) continue;
            }
            // attract
            Z[from] = true;
            str[from] = owner(from) == pl ? v : -1;
            Q.push(from);
#ifndef NDEBUG
            // maybe report event
            if (trace >= 3) {
                logger << "\033[1;37mattracted \033[36m" << label_vertex(from) << "\033[m by \033[1;36m" << pl << "\033[m";
                if (owner(from) == pl) logger << " (via " << label_vertex(v) << ")" << std::endl;
                else logger << " (forced)" << std::endl;
            }
#endif
        }
    }
}